

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.cpp
# Opt level: O1

int __thiscall blc::tools::pipe::pipe(pipe *this,int *__pipedes)

{
  bool *__p;
  string *psVar1;
  mutex *pmVar2;
  
  (this->super_stream)._vptr_stream = (_func_int **)&PTR_write_0011aa80;
  __p = (bool *)operator_new(1);
  *__p = false;
  (this->_closed).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_ptr = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<bool*>
            (&(this->_closed).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount,__p);
  psVar1 = (string *)operator_new(0x20);
  (psVar1->_M_dataplus)._M_p = (pointer)&psVar1->field_2;
  psVar1->_M_string_length = 0;
  (psVar1->field_2)._M_local_buf[0] = '\0';
  this->_in = psVar1;
  psVar1 = (string *)operator_new(0x20);
  (psVar1->_M_dataplus)._M_p = (pointer)&psVar1->field_2;
  psVar1->_M_string_length = 0;
  (psVar1->field_2)._M_local_buf[0] = '\0';
  this->_out = psVar1;
  pmVar2 = (mutex *)operator_new(0x28);
  *(undefined8 *)((long)&(pmVar2->super___mutex_base)._M_mutex + 0x10) = 0;
  (pmVar2->super___mutex_base)._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (pmVar2->super___mutex_base)._M_mutex.__align = 0;
  *(undefined8 *)((long)&(pmVar2->super___mutex_base)._M_mutex + 8) = 0;
  (pmVar2->super___mutex_base)._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  this->_inMut = pmVar2;
  pmVar2 = (mutex *)operator_new(0x28);
  *(undefined8 *)((long)&(pmVar2->super___mutex_base)._M_mutex + 0x10) = 0;
  (pmVar2->super___mutex_base)._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (pmVar2->super___mutex_base)._M_mutex.__align = 0;
  *(undefined8 *)((long)&(pmVar2->super___mutex_base)._M_mutex + 8) = 0;
  (pmVar2->super___mutex_base)._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  this->_outMut = pmVar2;
  this->_master = true;
  this->_block = false;
  return (int)pmVar2;
}

Assistant:

blc::tools::pipe::pipe() : _closed(new bool(false)) {
	this->_in = new std::string;
	this->_out = new std::string;
	this->_inMut = new std::mutex;
	this->_outMut = new std::mutex;
	this->_master = true;
	this->_block = false;
}